

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  BasePort *pBVar7;
  ostream *poVar8;
  PortType portType;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t status;
  string portDescription;
  stringstream debugStream;
  ofstream outFile;
  AmpIO Board;
  uchar buffer [2048];
  uint32_t local_1a44;
  ulong local_1a40;
  long *local_1a38;
  char *local_1a30;
  long local_1a28 [2];
  stringstream local_1a18 [16];
  ostream local_1a08 [112];
  ios_base local_1998 [264];
  long local_1890 [4];
  int aiStack_1870 [120];
  undefined1 local_1690 [3672];
  uchar local_838 [2056];
  
  BasePort::DefaultPort_abi_cxx11_();
  uVar13 = 0;
  if (1 < argc) {
    local_1a40 = 0;
    uVar12 = 1;
    iVar5 = 0;
    do {
      pcVar1 = local_1a30;
      pcVar11 = argv[uVar12];
      if (*pcVar11 == '-') {
        if (pcVar11[1] != 'p') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Usage: instrument <board-num> [-pP]",0x23);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
          std::ostream::put('0');
          poVar8 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"       where <board-num> = rotary switch setting (0-15)",0x37);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          poVar8 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"             P = port number (default 0)",0x28);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          poVar8 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"       can also specify -pfwP, -pethP or -pudp",0x2e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          iVar5 = 0;
          std::ostream::flush();
          goto LAB_00105f17;
        }
        strlen(pcVar11 + 2);
        std::__cxx11::string::_M_replace((ulong)&local_1a38,0,pcVar1,(ulong)(pcVar11 + 2));
      }
      else {
        if (iVar5 == 0) {
          iVar4 = atoi(pcVar11);
          local_1a40 = CONCAT44(extraout_var,iVar4);
        }
        iVar5 = iVar5 + 1;
      }
      uVar12 = uVar12 + 1;
      uVar13 = local_1a40;
    } while ((uint)argc != uVar12);
  }
  std::__cxx11::stringstream::stringstream(local_1a18,_S_out|_S_in);
  pBVar7 = PortFactory((char *)local_1a38,local_1a08);
  if (pBVar7 == (BasePort *)0x0) {
    PrintDebugStream((stringstream *)local_1a18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create port using: ",0x1d);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_1a38,(long)local_1a30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    iVar5 = -1;
    std::ostream::flush();
    goto LAB_00105ef9;
  }
  iVar5 = (*pBVar7->_vptr_BasePort[0x11])(pBVar7);
  if ((char)iVar5 == '\0') {
    PrintDebugStream((stringstream *)local_1a18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to initialize ",0x15);
    uVar10 = (*pBVar7->_vptr_BasePort[0xf])(pBVar7);
    BasePort::PortTypeString_abi_cxx11_((string *)local_1690,(BasePort *)(ulong)uVar10,portType);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_1690._0_8_,local_1690._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((undefined1 *)local_1690._0_8_ != local_1690 + 0x10) {
      operator_delete((void *)local_1690._0_8_,(ulong)(local_1690._16_8_ + 1));
    }
    iVar5 = -1;
    goto LAB_00105ef9;
  }
  uVar12 = uVar13 & 0xff;
  AmpIO::AmpIO((AmpIO *)local_1690,(uint8_t)uVar13);
  (*pBVar7->_vptr_BasePort[0xd])(pBVar7);
  uVar6 = BoardIO::GetFirmwareVersion((BoardIO *)local_1690);
  if (uVar6 < 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Instrument read requires firmware version 7+ (detected version ",0x3f);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    (*pBVar7->_vptr_BasePort[0xe])(pBVar7,uVar12);
LAB_00105ede:
    (*pBVar7->_vptr_BasePort[0xb])(pBVar7);
    iVar5 = -1;
  }
  else {
    local_1a44 = BoardIO::ReadStatus((BoardIO *)local_1690);
    bVar2 = AmpIO::DallasReadMemory((AmpIO *)local_1690,0,local_838,0x800);
    bVar3 = AmpIO::DallasReadStatus((AmpIO *)local_1690,&local_1a44);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to read DS2505 status",0x1c);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      (*pBVar7->_vptr_BasePort[0xe])(pBVar7,uVar12);
      goto LAB_00105ede;
    }
    (*pBVar7->_vptr_BasePort[0xe])(pBVar7,uVar12);
    (*pBVar7->_vptr_BasePort[0xb])(pBVar7);
    uVar6 = local_1a44;
    if ((local_1a44 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"DS2505 interface not enabled (hardware problem)",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      iVar5 = -1;
      std::ostream::flush();
    }
    else {
      uVar10 = local_1a44 >> 1 & 3;
      if (uVar10 == 1) {
        if (local_1a44 >> 0x18 == 0xb) {
          if (-1 < (short)local_1a44) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Measured rise time: ",0x14);
            poVar8 = std::ostream::_M_insert<double>((double)(uVar6 >> 0x10 & 0xff) / 49.152);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," microseconds",0xd);
            std::endl<char,std::char_traits<char>>(poVar8);
          }
          if (bVar2) {
            std::ofstream::ofstream(local_1890,"instrument.txt",_S_bin);
            if (*(int *)((long)aiStack_1870 + *(long *)(local_1890[0] + -0x18)) == 0) {
              std::ostream::write((char *)local_1890,(long)local_838);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Data written to instrument.txt",0x1e);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              iVar5 = 0;
              std::ofstream::close();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Failed to open instrument.txt for writing",0x29);
              iVar5 = -1;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            }
            std::ofstream::~ofstream(local_1890);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Failed to read instrument memory",0x20);
            iVar5 = -1;
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown device family code: 0x",0x1e);
          *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) =
               *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 8
          ;
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," (DS2505 should be 0x0B)",0x18)
          ;
          iVar5 = -1;
          std::endl<char,std::char_traits<char>>(poVar8);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to communicate with DS2505",0x21);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        iVar5 = -1;
        if (uVar10 == 3) {
          lVar9 = 0x40;
          pcVar11 = "  - Did not received ACK from DS2505 -- is dMIB signal jumpered?";
        }
        else {
          if (uVar10 != 2) goto LAB_00105eec;
          lVar9 = 0x41;
          pcVar11 = "  - DOUT3 did not reach high state -- is pullup resistor missing?";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
    }
  }
LAB_00105eec:
  AmpIO::~AmpIO((AmpIO *)local_1690);
LAB_00105ef9:
  std::__cxx11::stringstream::~stringstream(local_1a18);
  std::ios_base::~ios_base(local_1998);
LAB_00105f17:
  if (local_1a38 != local_1a28) {
    operator_delete(local_1a38,local_1a28[0] + 1);
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv)
{
    int i;
    int board = 0;

    std::string portDescription = BasePort::DefaultPort();

    if (argc > 1) {
        int args_found = 0;
        for (i = 1; i < argc; i++) {
            if (argv[i][0] == '-') {
                if (argv[i][1] == 'p') {
                    portDescription = argv[i]+2;
                }
                else {
                    std::cerr << "Usage: instrument <board-num> [-pP]" << std::endl
                              << "       where <board-num> = rotary switch setting (0-15)" << std::endl
                              << "             P = port number (default 0)" << std::endl
                              << "       can also specify -pfwP, -pethP or -pudp" << std::endl;
                    return 0;
                }
            }
            else {
                if (args_found == 0)
                    board = atoi(argv[i]);
                args_found++;
            }
        }
    }

    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    BasePort *Port = PortFactory(portDescription.c_str(), debugStream);
    if (!Port) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to create port using: " << portDescription << std::endl;
        return -1;
    }
    if (!Port->IsOK()) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to initialize " << Port->GetPortTypeString() << std::endl;
        return -1;
    }

    AmpIO Board(board);
    Port->AddBoard(&Board);

    uint32_t fver = Board.GetFirmwareVersion();
    if (fver < 7) {
        std::cerr << "Instrument read requires firmware version 7+ (detected version " << fver << ")" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }
    uint32_t status = Board.ReadStatus();

    // Now, we try to read the Dallas chip. This will also populate the status field.
    unsigned char buffer[2048];  // Buffer for entire contents of DS2505 memory (2 Kbytes)
    bool ret = Board.DallasReadMemory(0, (unsigned char *) buffer, sizeof(buffer));
    if (!Board.DallasReadStatus(status)) {
        std::cerr << "Failed to read DS2505 status" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }
    // No longer need these
    Port->RemoveBoard(board);
    delete Port;
    if ((status & 0x00000001) != 0x00000001) {
        std::cerr << "DS2505 interface not enabled (hardware problem)" << std::endl;
        return -1;
    }
    unsigned char ds_reset = static_cast<unsigned char>((status & 0x00000006)>>1);
    if (ds_reset != 1) {
        std::cerr << "Failed to communicate with DS2505" << std::endl;
        if (ds_reset == 2)
            std::cerr << "  - DOUT3 did not reach high state -- is pullup resistor missing?" << std::endl;
        else if (ds_reset == 3)
            std::cerr << "  - Did not received ACK from DS2505 -- is dMIB signal jumpered?" << std::endl;
        return -1;
    }
    unsigned char family_code = static_cast<unsigned char>((status&0xFF000000)>>24);
    if (family_code != 0x0B) {
        std::cerr << "Unknown device family code: 0x" << std::hex << static_cast<unsigned int>(family_code)
                  << " (DS2505 should be 0x0B)" << std::endl;
        return -1;
    }
    bool useDS2480B = (status & 0x00008000) == 0x00008000;
    if (!useDS2480B) {
        unsigned char rise_time = static_cast<unsigned char>((status&0x00FF0000)>>16);
        std::cout << "Measured rise time: " << (rise_time/49.152) << " microseconds" << std::endl;
    }
    if (!ret) {
        std::cerr << "Failed to read instrument memory" << std::endl;
        return -1;
    }
    std::ofstream outFile("instrument.txt", std::ios::binary);
    if (outFile.good()) {
        outFile.write((char *)buffer, sizeof(buffer));
        std::cout << "Data written to instrument.txt" << std::endl;
    }
    else {
        std::cerr << "Failed to open instrument.txt for writing" << std::endl;
        return -1;
    }
    outFile.close();
    return 0;
}